

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sobol.cpp
# Opt level: O0

void __thiscall Sobol::CmdNext(Sobol *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  element_type *this_00;
  uint32_t in_stack_ffffffffffffff08;
  VkPipelineBindPoint in_stack_ffffffffffffff0c;
  CommandBuffer *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  CommandBuffer *in_stack_ffffffffffffff20;
  Ptr<PipelineLayout> *in_stack_ffffffffffffff28;
  CommandBuffer *this_01;
  allocator_type *in_stack_ffffffffffffff38;
  CommandBuffer *pCVar1;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_49;
  undefined1 local_48 [24];
  element_type *local_30;
  
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16dfc1);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_ffffffffffffff10,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_30 = (element_type *)0x1;
  local_48._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x16e00c);
  __l._M_len = in_stack_ffffffffffffff50;
  __l._M_array = in_stack_ffffffffffffff48;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(in_stack_ffffffffffffff40,__l,in_stack_ffffffffffffff38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x16e067);
  myvk::CommandBuffer::CmdBindDescriptorSets
            (in_stack_ffffffffffffff20,
             (vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (Ptr<PipelineLayout> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x16e088);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)in_stack_ffffffffffffff20);
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(&local_49);
  pCVar1 = (CommandBuffer *)local_48;
  this_01 = (CommandBuffer *)(local_48 + 0x10);
  do {
    this_01 = (CommandBuffer *)
              &this_01[-1].m_command_pool_ptr.
               super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x16e0da);
  } while (this_01 != pCVar1);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16e0fb);
  myvk::CommandBuffer::CmdPushConstants
            (this_01,in_stack_ffffffffffffff28,
             (VkShaderStageFlags)((ulong)in_stack_ffffffffffffff20 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10
            );
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16e12d);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_ffffffffffffff10,
             (shared_ptr<myvk::ComputePipeline> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  myvk::CommandBuffer::CmdBindPipeline
            (this_00,(Ptr<PipelineBase> *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x16e165);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16e172);
  myvk::CommandBuffer::CmdDispatch
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,0);
  return;
}

Assistant:

void Sobol::CmdNext(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) {
	command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline_layout, VK_PIPELINE_BIND_POINT_COMPUTE, {});
	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, 0, sizeof(uint32_t), &m_dimension);
	command_buffer->CmdBindPipeline(m_compute_pipeline);
	command_buffer->CmdDispatch(1, 1, 1);
}